

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O2

DdNode * Cudd_addNonSimCompose(DdManager *dd,DdNode *f,DdNode **vector)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *cube;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint lastsub;
  DdNode *key;
  
  key = dd->one;
  piVar1 = (int *)(((ulong)key & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 2;
  uVar5 = dd->size;
  cube = key;
LAB_00667630:
  do {
    if ((int)uVar5 < 1) {
      do {
        uVar5 = dd->size;
        uVar7 = (int)uVar5 >> 0x1f & uVar5;
        uVar6 = uVar5;
        do {
          uVar5 = uVar5 - 1;
          lastsub = uVar7;
          if ((int)uVar6 < 1) break;
          iVar2 = ddIsIthAddVar(dd,vector[uVar5],uVar6 - 1);
          lastsub = uVar6;
          uVar6 = uVar6 - 1;
        } while (iVar2 != 0);
        dd->reordered = 0;
        pDVar3 = cuddAddNonSimComposeRecur(dd,f,vector,key,cube,lastsub);
        if (pDVar3 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
        }
      } while (dd->reordered == 1);
      Cudd_RecursiveDeref(dd,key);
      Cudd_RecursiveDeref(dd,cube);
      if (pDVar3 == (DdNode *)0x0) {
LAB_00667822:
        pDVar3 = (DdNode *)0x0;
      }
      else {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
      }
      return pDVar3;
    }
    uVar6 = uVar5 - 1;
    iVar2 = ddIsIthAddVar(dd,vector[uVar6],uVar5 - 1);
    uVar5 = uVar6;
  } while (iVar2 != 0);
  pDVar3 = Cudd_addIthVar(dd,uVar6);
  if (pDVar3 == (DdNode *)0x0) {
LAB_006677e4:
    pDVar3 = cube;
    Cudd_RecursiveDeref(dd,key);
  }
  else {
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar4 = Cudd_addApply(dd,Cudd_addTimes,pDVar3,cube);
    if (pDVar4 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,key);
      key = cube;
    }
    else {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,cube);
      cube = Cudd_addApply(dd,Cudd_addXnor,pDVar3,vector[uVar6]);
      if (cube != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)cube & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar3);
        pDVar3 = Cudd_addApply(dd,Cudd_addTimes,key,cube);
        if (pDVar3 == (DdNode *)0x0) goto LAB_006677e4;
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,key);
        Cudd_RecursiveDeref(dd,cube);
        key = pDVar3;
        cube = pDVar4;
        goto LAB_00667630;
      }
    }
    Cudd_RecursiveDeref(dd,key);
  }
  Cudd_RecursiveDeref(dd,pDVar3);
  goto LAB_00667822;
}

Assistant:

DdNode *
Cudd_addNonSimCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vector)
{
    DdNode              *cube, *key, *var, *tmp, *piece;
    DdNode              *res;
    int                 i, lastsub;

    /* The cache entry for this function is composed of three parts:
    ** f itself, the replacement relation, and the cube of the
    ** variables being substituted.
    ** The replacement relation is the product of the terms (yi EXNOR gi).
    ** This apporach allows us to use the global cache for this function,
    ** with great savings in memory with respect to using arrays for the
    ** cache entries.
    ** First we build replacement relation and cube of substituted
    ** variables from the vector specifying the desired composition.
    */
    key = DD_ONE(dd);
    cuddRef(key);
    cube = DD_ONE(dd);
    cuddRef(cube);
    for (i = (int) dd->size - 1; i >= 0; i--) {
        if (ddIsIthAddVar(dd,vector[i],(unsigned int)i)) {
            continue;
        }
        var = Cudd_addIthVar(dd,i);
        if (var == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(var);
        /* Update cube. */
        tmp = Cudd_addApply(dd,Cudd_addTimes,var,cube);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,cube);
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cube);
        cube = tmp;
        /* Update replacement relation. */
        piece = Cudd_addApply(dd,Cudd_addXnor,var,vector[i]);
        if (piece == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(piece);
        Cudd_RecursiveDeref(dd,var);
        tmp = Cudd_addApply(dd,Cudd_addTimes,key,piece);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,piece);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,key);
        Cudd_RecursiveDeref(dd,piece);
        key = tmp;
    }

    /* Now try composition, until no reordering occurs. */
    do {
        /* Find real substitution with largest index. */
        for (lastsub = dd->size - 1; lastsub >= 0; lastsub--) {
            if (!ddIsIthAddVar(dd,vector[lastsub],(unsigned int)lastsub)) {
                break;
            }
        }

        /* Recursively solve the problem. */
        dd->reordered = 0;
        res = cuddAddNonSimComposeRecur(dd,f,vector,key,cube,lastsub+1);
        if (res != NULL) cuddRef(res);

    } while (dd->reordered == 1);

    Cudd_RecursiveDeref(dd,key);
    Cudd_RecursiveDeref(dd,cube);
    if (res != NULL) cuddDeref(res);
    return(res);

}